

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_aco.cpp
# Opt level: O0

void aco_resume(aco_t *resume_co)

{
  aco_t *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  size_t sVar17;
  void *pvVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  bool bVar21;
  __uint128_t xmm7_1;
  __uint128_t xmm6_1;
  __uint128_t xmm5_1;
  __uint128_t xmm4_1;
  __uint128_t xmm3_1;
  __uint128_t xmm2_1;
  __uint128_t xmm1_1;
  __uint128_t xmm0_1;
  __uint128_t xmm7;
  __uint128_t xmm6;
  __uint128_t xmm5;
  __uint128_t xmm4;
  __uint128_t xmm3;
  __uint128_t xmm2;
  __uint128_t xmm1;
  __uint128_t xmm0;
  aco_t *owner_co;
  aco_t *resume_co_local;
  
  bVar21 = false;
  if ((resume_co != (aco_t *)0x0) && (bVar21 = false, resume_co->main_co != (aco_t *)0x0)) {
    bVar21 = resume_co->is_end == '\0';
  }
  if (!bVar21) {
    abort();
  }
  if (resume_co->share_stack->owner != resume_co) {
    if (resume_co->share_stack->owner != (aco_t *)0x0) {
      paVar1 = resume_co->share_stack->owner;
      if (paVar1->share_stack != resume_co->share_stack) {
        abort();
      }
      bVar21 = false;
      if (paVar1->reg[5] <= paVar1->share_stack->align_retptr) {
        bVar21 = (void *)((long)paVar1->share_stack->align_highptr -
                         paVar1->share_stack->align_limit) <= paVar1->reg[5];
      }
      if (!bVar21) {
        abort();
      }
      (paVar1->save_stack).valid_sz = (long)paVar1->share_stack->align_retptr - (long)paVar1->reg[5]
      ;
      if ((paVar1->save_stack).sz < (paVar1->save_stack).valid_sz) {
        free((paVar1->save_stack).ptr);
        (paVar1->save_stack).ptr = (void *)0x0;
        do {
          (paVar1->save_stack).sz = (paVar1->save_stack).sz << 1;
          if ((paVar1->save_stack).sz == 0) {
            abort();
          }
        } while ((paVar1->save_stack).sz < (paVar1->save_stack).valid_sz);
        pvVar18 = malloc((paVar1->save_stack).sz);
        (paVar1->save_stack).ptr = pvVar18;
        if ((paVar1->save_stack).ptr == (void *)0x0) {
          fprintf(_stderr,"Aborting: failed to allocate memory: %s:%d:%s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CandyMi[P]libeco/lib/eco_aco.cpp"
                  ,0x1a2,"void aco_resume(aco_t *)");
          abort();
        }
      }
      if ((paVar1->save_stack).valid_sz != 0) {
        if ((((((ulong)paVar1->reg[5] & 0xf) == 0) && (((ulong)(paVar1->save_stack).ptr & 0xf) == 0)
             ) && (((paVar1->save_stack).valid_sz & 0xf) == 8)) &&
           ((paVar1->save_stack).valid_sz >> 4 < 9)) {
          switch((paVar1->save_stack).valid_sz >> 4) {
          case 0:
            break;
          case 1:
            uVar2 = *paVar1->reg[5];
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            break;
          case 2:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            break;
          case 3:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            uVar5 = *(undefined8 *)((long)paVar1->reg[5] + 0x20);
            uVar6 = *(undefined8 *)((long)paVar1->reg[5] + 0x28);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x28) = uVar6;
            *(undefined8 *)((long)pvVar18 + 0x20) = uVar5;
            break;
          case 4:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            uVar5 = *(undefined8 *)((long)paVar1->reg[5] + 0x20);
            uVar6 = *(undefined8 *)((long)paVar1->reg[5] + 0x28);
            uVar7 = *(undefined8 *)((long)paVar1->reg[5] + 0x30);
            uVar8 = *(undefined8 *)((long)paVar1->reg[5] + 0x38);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x28) = uVar6;
            *(undefined8 *)((long)pvVar18 + 0x20) = uVar5;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x38) = uVar8;
            *(undefined8 *)((long)pvVar18 + 0x30) = uVar7;
            break;
          case 5:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            uVar5 = *(undefined8 *)((long)paVar1->reg[5] + 0x20);
            uVar6 = *(undefined8 *)((long)paVar1->reg[5] + 0x28);
            uVar7 = *(undefined8 *)((long)paVar1->reg[5] + 0x30);
            uVar8 = *(undefined8 *)((long)paVar1->reg[5] + 0x38);
            uVar9 = *(undefined8 *)((long)paVar1->reg[5] + 0x40);
            uVar10 = *(undefined8 *)((long)paVar1->reg[5] + 0x48);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x28) = uVar6;
            *(undefined8 *)((long)pvVar18 + 0x20) = uVar5;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x38) = uVar8;
            *(undefined8 *)((long)pvVar18 + 0x30) = uVar7;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x48) = uVar10;
            *(undefined8 *)((long)pvVar18 + 0x40) = uVar9;
            break;
          case 6:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            uVar5 = *(undefined8 *)((long)paVar1->reg[5] + 0x20);
            uVar6 = *(undefined8 *)((long)paVar1->reg[5] + 0x28);
            uVar7 = *(undefined8 *)((long)paVar1->reg[5] + 0x30);
            uVar8 = *(undefined8 *)((long)paVar1->reg[5] + 0x38);
            uVar9 = *(undefined8 *)((long)paVar1->reg[5] + 0x40);
            uVar10 = *(undefined8 *)((long)paVar1->reg[5] + 0x48);
            uVar11 = *(undefined8 *)((long)paVar1->reg[5] + 0x50);
            uVar12 = *(undefined8 *)((long)paVar1->reg[5] + 0x58);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x28) = uVar6;
            *(undefined8 *)((long)pvVar18 + 0x20) = uVar5;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x38) = uVar8;
            *(undefined8 *)((long)pvVar18 + 0x30) = uVar7;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x48) = uVar10;
            *(undefined8 *)((long)pvVar18 + 0x40) = uVar9;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x58) = uVar12;
            *(undefined8 *)((long)pvVar18 + 0x50) = uVar11;
            break;
          case 7:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            uVar5 = *(undefined8 *)((long)paVar1->reg[5] + 0x20);
            uVar6 = *(undefined8 *)((long)paVar1->reg[5] + 0x28);
            uVar7 = *(undefined8 *)((long)paVar1->reg[5] + 0x30);
            uVar8 = *(undefined8 *)((long)paVar1->reg[5] + 0x38);
            uVar9 = *(undefined8 *)((long)paVar1->reg[5] + 0x40);
            uVar10 = *(undefined8 *)((long)paVar1->reg[5] + 0x48);
            uVar11 = *(undefined8 *)((long)paVar1->reg[5] + 0x50);
            uVar12 = *(undefined8 *)((long)paVar1->reg[5] + 0x58);
            uVar13 = *(undefined8 *)((long)paVar1->reg[5] + 0x60);
            uVar14 = *(undefined8 *)((long)paVar1->reg[5] + 0x68);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x28) = uVar6;
            *(undefined8 *)((long)pvVar18 + 0x20) = uVar5;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x38) = uVar8;
            *(undefined8 *)((long)pvVar18 + 0x30) = uVar7;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x48) = uVar10;
            *(undefined8 *)((long)pvVar18 + 0x40) = uVar9;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x58) = uVar12;
            *(undefined8 *)((long)pvVar18 + 0x50) = uVar11;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x68) = uVar14;
            *(undefined8 *)((long)pvVar18 + 0x60) = uVar13;
            break;
          case 8:
            uVar2 = *paVar1->reg[5];
            uVar3 = *(undefined8 *)((long)paVar1->reg[5] + 0x10);
            uVar4 = *(undefined8 *)((long)paVar1->reg[5] + 0x18);
            uVar5 = *(undefined8 *)((long)paVar1->reg[5] + 0x20);
            uVar6 = *(undefined8 *)((long)paVar1->reg[5] + 0x28);
            uVar7 = *(undefined8 *)((long)paVar1->reg[5] + 0x30);
            uVar8 = *(undefined8 *)((long)paVar1->reg[5] + 0x38);
            uVar9 = *(undefined8 *)((long)paVar1->reg[5] + 0x40);
            uVar10 = *(undefined8 *)((long)paVar1->reg[5] + 0x48);
            uVar11 = *(undefined8 *)((long)paVar1->reg[5] + 0x50);
            uVar12 = *(undefined8 *)((long)paVar1->reg[5] + 0x58);
            uVar13 = *(undefined8 *)((long)paVar1->reg[5] + 0x60);
            uVar14 = *(undefined8 *)((long)paVar1->reg[5] + 0x68);
            uVar15 = *(undefined8 *)((long)paVar1->reg[5] + 0x70);
            uVar16 = *(undefined8 *)((long)paVar1->reg[5] + 0x78);
            puVar20 = (undefined8 *)(paVar1->save_stack).ptr;
            puVar20[1] = *(undefined8 *)((long)paVar1->reg[5] + 8);
            *puVar20 = uVar2;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x18) = uVar4;
            *(undefined8 *)((long)pvVar18 + 0x10) = uVar3;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x28) = uVar6;
            *(undefined8 *)((long)pvVar18 + 0x20) = uVar5;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x38) = uVar8;
            *(undefined8 *)((long)pvVar18 + 0x30) = uVar7;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x48) = uVar10;
            *(undefined8 *)((long)pvVar18 + 0x40) = uVar9;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x58) = uVar12;
            *(undefined8 *)((long)pvVar18 + 0x50) = uVar11;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x68) = uVar14;
            *(undefined8 *)((long)pvVar18 + 0x60) = uVar13;
            pvVar18 = (paVar1->save_stack).ptr;
            *(undefined8 *)((long)pvVar18 + 0x78) = uVar16;
            *(undefined8 *)((long)pvVar18 + 0x70) = uVar15;
          }
          *(undefined8 *)((long)(paVar1->save_stack).ptr + ((paVar1->save_stack).valid_sz - 8)) =
               *(undefined8 *)((long)paVar1->reg[5] + ((paVar1->save_stack).valid_sz - 8));
        }
        else {
          memcpy((paVar1->save_stack).ptr,paVar1->reg[5],(paVar1->save_stack).valid_sz);
        }
        (paVar1->save_stack).ct_save = (paVar1->save_stack).ct_save + 1;
      }
      if ((paVar1->save_stack).max_cpsz < (paVar1->save_stack).valid_sz) {
        (paVar1->save_stack).max_cpsz = (paVar1->save_stack).valid_sz;
      }
      paVar1->share_stack->owner = (aco_t *)0x0;
      paVar1->share_stack->align_validsz = 0;
    }
    if (resume_co->share_stack->owner != (aco_t *)0x0) {
      abort();
    }
    if (resume_co->share_stack->align_limit - 8 < (resume_co->save_stack).valid_sz) {
      abort();
    }
    if ((resume_co->save_stack).valid_sz != 0) {
      if (((((ulong)(resume_co->save_stack).ptr & 0xf) == 0) &&
          (((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz & 0xf) ==
           0)) && ((((resume_co->save_stack).valid_sz & 0xf) == 8 &&
                   ((resume_co->save_stack).valid_sz >> 4 < 9)))) {
        switch((resume_co->save_stack).valid_sz >> 4) {
        case 0:
          break;
        case 1:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          break;
        case 2:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          break;
        case 3:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar5 = *(undefined8 *)((long)pvVar18 + 0x20);
          uVar6 = *(undefined8 *)((long)pvVar18 + 0x28);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x28 - sVar17)) = uVar6;
          *(undefined8 *)((long)pvVar18 + (0x20 - sVar17)) = uVar5;
          break;
        case 4:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar5 = *(undefined8 *)((long)pvVar18 + 0x20);
          uVar6 = *(undefined8 *)((long)pvVar18 + 0x28);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar7 = *(undefined8 *)((long)pvVar18 + 0x30);
          uVar8 = *(undefined8 *)((long)pvVar18 + 0x38);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x28 - sVar17)) = uVar6;
          *(undefined8 *)((long)pvVar18 + (0x20 - sVar17)) = uVar5;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x38 - sVar17)) = uVar8;
          *(undefined8 *)((long)pvVar18 + (0x30 - sVar17)) = uVar7;
          break;
        case 5:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar5 = *(undefined8 *)((long)pvVar18 + 0x20);
          uVar6 = *(undefined8 *)((long)pvVar18 + 0x28);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar7 = *(undefined8 *)((long)pvVar18 + 0x30);
          uVar8 = *(undefined8 *)((long)pvVar18 + 0x38);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar9 = *(undefined8 *)((long)pvVar18 + 0x40);
          uVar10 = *(undefined8 *)((long)pvVar18 + 0x48);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x28 - sVar17)) = uVar6;
          *(undefined8 *)((long)pvVar18 + (0x20 - sVar17)) = uVar5;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x38 - sVar17)) = uVar8;
          *(undefined8 *)((long)pvVar18 + (0x30 - sVar17)) = uVar7;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x48 - sVar17)) = uVar10;
          *(undefined8 *)((long)pvVar18 + (0x40 - sVar17)) = uVar9;
          break;
        case 6:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar5 = *(undefined8 *)((long)pvVar18 + 0x20);
          uVar6 = *(undefined8 *)((long)pvVar18 + 0x28);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar7 = *(undefined8 *)((long)pvVar18 + 0x30);
          uVar8 = *(undefined8 *)((long)pvVar18 + 0x38);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar9 = *(undefined8 *)((long)pvVar18 + 0x40);
          uVar10 = *(undefined8 *)((long)pvVar18 + 0x48);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar11 = *(undefined8 *)((long)pvVar18 + 0x50);
          uVar12 = *(undefined8 *)((long)pvVar18 + 0x58);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x28 - sVar17)) = uVar6;
          *(undefined8 *)((long)pvVar18 + (0x20 - sVar17)) = uVar5;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x38 - sVar17)) = uVar8;
          *(undefined8 *)((long)pvVar18 + (0x30 - sVar17)) = uVar7;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x48 - sVar17)) = uVar10;
          *(undefined8 *)((long)pvVar18 + (0x40 - sVar17)) = uVar9;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x58 - sVar17)) = uVar12;
          *(undefined8 *)((long)pvVar18 + (0x50 - sVar17)) = uVar11;
          break;
        case 7:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar5 = *(undefined8 *)((long)pvVar18 + 0x20);
          uVar6 = *(undefined8 *)((long)pvVar18 + 0x28);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar7 = *(undefined8 *)((long)pvVar18 + 0x30);
          uVar8 = *(undefined8 *)((long)pvVar18 + 0x38);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar9 = *(undefined8 *)((long)pvVar18 + 0x40);
          uVar10 = *(undefined8 *)((long)pvVar18 + 0x48);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar11 = *(undefined8 *)((long)pvVar18 + 0x50);
          uVar12 = *(undefined8 *)((long)pvVar18 + 0x58);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar13 = *(undefined8 *)((long)pvVar18 + 0x60);
          uVar14 = *(undefined8 *)((long)pvVar18 + 0x68);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x28 - sVar17)) = uVar6;
          *(undefined8 *)((long)pvVar18 + (0x20 - sVar17)) = uVar5;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x38 - sVar17)) = uVar8;
          *(undefined8 *)((long)pvVar18 + (0x30 - sVar17)) = uVar7;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x48 - sVar17)) = uVar10;
          *(undefined8 *)((long)pvVar18 + (0x40 - sVar17)) = uVar9;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x58 - sVar17)) = uVar12;
          *(undefined8 *)((long)pvVar18 + (0x50 - sVar17)) = uVar11;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x68 - sVar17)) = uVar14;
          *(undefined8 *)((long)pvVar18 + (0x60 - sVar17)) = uVar13;
          break;
        case 8:
          puVar20 = (undefined8 *)(resume_co->save_stack).ptr;
          uVar2 = *puVar20;
          pvVar18 = (resume_co->save_stack).ptr;
          uVar3 = *(undefined8 *)((long)pvVar18 + 0x10);
          uVar4 = *(undefined8 *)((long)pvVar18 + 0x18);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar5 = *(undefined8 *)((long)pvVar18 + 0x20);
          uVar6 = *(undefined8 *)((long)pvVar18 + 0x28);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar7 = *(undefined8 *)((long)pvVar18 + 0x30);
          uVar8 = *(undefined8 *)((long)pvVar18 + 0x38);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar9 = *(undefined8 *)((long)pvVar18 + 0x40);
          uVar10 = *(undefined8 *)((long)pvVar18 + 0x48);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar11 = *(undefined8 *)((long)pvVar18 + 0x50);
          uVar12 = *(undefined8 *)((long)pvVar18 + 0x58);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar13 = *(undefined8 *)((long)pvVar18 + 0x60);
          uVar14 = *(undefined8 *)((long)pvVar18 + 0x68);
          pvVar18 = (resume_co->save_stack).ptr;
          uVar15 = *(undefined8 *)((long)pvVar18 + 0x70);
          uVar16 = *(undefined8 *)((long)pvVar18 + 0x78);
          puVar19 = (undefined8 *)
                    ((long)resume_co->share_stack->align_retptr - (resume_co->save_stack).valid_sz);
          puVar19[1] = puVar20[1];
          *puVar19 = uVar2;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x18 - sVar17)) = uVar4;
          *(undefined8 *)((long)pvVar18 + (0x10 - sVar17)) = uVar3;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x28 - sVar17)) = uVar6;
          *(undefined8 *)((long)pvVar18 + (0x20 - sVar17)) = uVar5;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x38 - sVar17)) = uVar8;
          *(undefined8 *)((long)pvVar18 + (0x30 - sVar17)) = uVar7;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x48 - sVar17)) = uVar10;
          *(undefined8 *)((long)pvVar18 + (0x40 - sVar17)) = uVar9;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x58 - sVar17)) = uVar12;
          *(undefined8 *)((long)pvVar18 + (0x50 - sVar17)) = uVar11;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x68 - sVar17)) = uVar14;
          *(undefined8 *)((long)pvVar18 + (0x60 - sVar17)) = uVar13;
          sVar17 = (resume_co->save_stack).valid_sz;
          pvVar18 = resume_co->share_stack->align_retptr;
          *(undefined8 *)((long)pvVar18 + (0x78 - sVar17)) = uVar16;
          *(undefined8 *)((long)pvVar18 + (0x70 - sVar17)) = uVar15;
        }
        *(undefined8 *)
         ((long)resume_co->share_stack->align_retptr +
         ((resume_co->save_stack).valid_sz - (resume_co->save_stack).valid_sz) + -8) =
             *(undefined8 *)
              ((long)(resume_co->save_stack).ptr + ((resume_co->save_stack).valid_sz - 8));
      }
      else {
        memcpy((void *)((long)resume_co->share_stack->align_retptr -
                       (resume_co->save_stack).valid_sz),(resume_co->save_stack).ptr,
               (resume_co->save_stack).valid_sz);
      }
      (resume_co->save_stack).ct_restore = (resume_co->save_stack).ct_restore + 1;
    }
    if ((resume_co->save_stack).max_cpsz < (resume_co->save_stack).valid_sz) {
      (resume_co->save_stack).max_cpsz = (resume_co->save_stack).valid_sz;
    }
    resume_co->share_stack->align_validsz = (resume_co->save_stack).valid_sz + 8;
    resume_co->share_stack->owner = resume_co;
  }
  puVar20 = (undefined8 *)__tls_get_addr(&PTR_001c5f60);
  *puVar20 = resume_co;
  acosw(resume_co->main_co,resume_co);
  paVar1 = resume_co->main_co;
  puVar20 = (undefined8 *)__tls_get_addr(&PTR_001c5f60);
  *puVar20 = paVar1;
  return;
}

Assistant:

aco_attr_no_asan
void aco_resume(aco_t* resume_co){
    assert(resume_co != nullptr && resume_co->main_co != nullptr
        && resume_co->is_end == 0
    );
    if(resume_co->share_stack->owner != resume_co){
        if(resume_co->share_stack->owner != nullptr){
            aco_t* owner_co = resume_co->share_stack->owner;
            assert(owner_co->share_stack == resume_co->share_stack);
#if defined(__i386__) || defined(__x86_64__) || defined(__aarch64__)
            assert(
                (
                    (uintptr_t)(owner_co->share_stack->align_retptr)
                    >=
                    (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP])
                )
                &&
                (
                    (uintptr_t)(owner_co->share_stack->align_highptr)
                    -
                    (uintptr_t)(owner_co->share_stack->align_limit)
                    <=
                    (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP])
                )
            );
            owner_co->save_stack.valid_sz =
                (uintptr_t)(owner_co->share_stack->align_retptr)
                -
                (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP]);
            if(owner_co->save_stack.sz < owner_co->save_stack.valid_sz){
                eco_free(owner_co->save_stack.ptr);
                owner_co->save_stack.ptr = nullptr;
                while(1){
                    owner_co->save_stack.sz = owner_co->save_stack.sz << 1;
                    assert(owner_co->save_stack.sz > 0);
                    if(owner_co->save_stack.sz >= owner_co->save_stack.valid_sz){
                        break;
                    }
                }
                owner_co->save_stack.ptr = eco_malloc(owner_co->save_stack.sz);
                assertalloc_ptr(owner_co->save_stack.ptr);
            }
            // TODO: optimize the performance penalty of memcpy function call
            //   for very short memory span
            if(owner_co->save_stack.valid_sz > 0) {
    #ifdef __x86_64__
                aco_amd64_optimized_memcpy_drop_in(
                    owner_co->save_stack.ptr,
                    owner_co->reg[ACO_REG_IDX_SP],
                    owner_co->save_stack.valid_sz
                );
    #else
                memcpy(
                    owner_co->save_stack.ptr,
                    owner_co->reg[ACO_REG_IDX_SP],
                    owner_co->save_stack.valid_sz
                );
    #endif
                owner_co->save_stack.ct_save++;
            }
            if(owner_co->save_stack.valid_sz > owner_co->save_stack.max_cpsz){
                owner_co->save_stack.max_cpsz = owner_co->save_stack.valid_sz;
            }
            owner_co->share_stack->owner = nullptr;
            owner_co->share_stack->align_validsz = 0;
#else
            #error "platform no support yet"
#endif
        }
        assert(resume_co->share_stack->owner == nullptr);
#if defined(__i386__) || defined(__x86_64__) || defined(__aarch64__)
        assert(
            resume_co->save_stack.valid_sz
            <=
            resume_co->share_stack->align_limit - sizeof(void*)
        );
        // TODO: optimize the performance penalty of memcpy function call
        //   for very short memory span
        if(resume_co->save_stack.valid_sz > 0) {
    #ifdef __x86_64__
            aco_amd64_optimized_memcpy_drop_in(
                (void*)(
                    (uintptr_t)(resume_co->share_stack->align_retptr)
                    -
                    resume_co->save_stack.valid_sz
                ),
                resume_co->save_stack.ptr,
                resume_co->save_stack.valid_sz
            );
    #else
            memcpy(
                (void*)(
                    (uintptr_t)(resume_co->share_stack->align_retptr)
                    -
                    resume_co->save_stack.valid_sz
                ),
                resume_co->save_stack.ptr,
                resume_co->save_stack.valid_sz
            );
    #endif
            resume_co->save_stack.ct_restore++;
        }
        if(resume_co->save_stack.valid_sz > resume_co->save_stack.max_cpsz){
            resume_co->save_stack.max_cpsz = resume_co->save_stack.valid_sz;
        }
        resume_co->share_stack->align_validsz = resume_co->save_stack.valid_sz + sizeof(void*);
        resume_co->share_stack->owner = resume_co;
#else
        #error "platform no support yet"
#endif
    }
    aco_gtls_co = resume_co;
    acosw(resume_co->main_co, resume_co);
    aco_gtls_co = resume_co->main_co;
}